

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  __m128 afVar20;
  binary_op_pow op;
  __m128 _b0;
  __m128 _p_2;
  __m256 _b0_avx;
  __m512 _b0_avx512;
  binary_op_pow local_1ad;
  int local_1ac;
  ulong local_1a8;
  Mat *local_1a0;
  Mat *local_198;
  Mat *local_190;
  ulong local_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float afStack_170 [2];
  float afStack_168 [6];
  float local_150 [2];
  float afStack_148 [2];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float afStack_120 [2];
  float afStack_118 [2];
  float afStack_110 [2];
  float afStack_108 [2];
  __m512 local_100;
  __m512 local_c0 [2];
  
  iVar8 = a->h;
  iVar4 = a->w;
  iVar1 = a->d;
  local_1a8 = (ulong)(uint)a->c;
  iVar2 = a->elempack;
  local_198 = a;
  local_190 = b;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar3 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_1a8) {
      local_188 = 0;
      local_1ac = iVar8 * iVar4 * iVar1 * iVar2;
      local_1a0 = c;
      do {
        iVar8 = local_1ac;
        pfVar10 = (float *)(local_198->cstep * local_188 * local_198->elemsize +
                           (long)local_198->data);
        pfVar9 = (float *)(local_1a0->cstep * local_188 * local_1a0->elemsize +
                          (long)local_1a0->data);
        local_100 = (__m512)vbroadcastss_avx512f(ZEXT416(*local_190->data));
        local_c0[0] = local_100;
        if (local_1ac < 0x10) {
          uVar6 = 0;
        }
        else {
          uVar7 = 0;
          do {
            uVar13 = *(undefined8 *)pfVar10;
            uVar12 = *(undefined8 *)(pfVar10 + 2);
            uVar14 = *(undefined8 *)(pfVar10 + 4);
            uVar15 = *(undefined8 *)(pfVar10 + 6);
            uVar16 = *(undefined8 *)(pfVar10 + 8);
            uVar17 = *(undefined8 *)(pfVar10 + 10);
            uVar18 = *(undefined8 *)(pfVar10 + 0xc);
            uVar19 = *(undefined8 *)(pfVar10 + 0xe);
            _local_140 = uVar13;
            _fStack_138 = uVar12;
            _fStack_130 = uVar14;
            _fStack_128 = uVar15;
            afStack_120 = (float  [2])uVar16;
            afStack_118 = (float  [2])uVar17;
            afStack_110 = (float  [2])uVar18;
            afStack_108 = (float  [2])uVar19;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      (&local_1ad,(__m512 *)&local_140,local_c0);
            *(undefined8 *)pfVar9 = uVar13;
            *(undefined8 *)(pfVar9 + 2) = uVar12;
            *(undefined8 *)(pfVar9 + 4) = uVar14;
            *(undefined8 *)(pfVar9 + 6) = uVar15;
            *(undefined8 *)(pfVar9 + 8) = uVar16;
            *(undefined8 *)(pfVar9 + 10) = uVar17;
            *(undefined8 *)(pfVar9 + 0xc) = uVar18;
            *(undefined8 *)(pfVar9 + 0xe) = uVar19;
            pfVar10 = pfVar10 + 0x10;
            pfVar9 = pfVar9 + 0x10;
            uVar6 = uVar7 + 0x10;
            iVar4 = uVar7 + 0x1f;
            uVar7 = uVar6;
          } while (iVar4 < iVar8);
        }
        fStack_13c = local_100[0];
        local_140 = local_100[0];
        fStack_134 = local_100[0];
        fStack_138 = local_100[0];
        fStack_12c = local_100[0];
        fStack_130 = local_100[0];
        fStack_124 = local_100[0];
        fStack_128 = local_100[0];
        if ((int)(uVar6 | 7) < iVar8) {
          uVar7 = uVar6;
          do {
            uVar13 = *(undefined8 *)pfVar10;
            uVar12 = *(undefined8 *)(pfVar10 + 2);
            uVar14 = *(undefined8 *)(pfVar10 + 4);
            uVar15 = *(undefined8 *)(pfVar10 + 6);
            _local_180 = uVar13;
            _fStack_178 = uVar12;
            afStack_170 = (float  [2])uVar14;
            afStack_168._0_8_ = uVar15;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                      (&local_1ad,(__m256 *)&local_180,(__m256 *)&local_140);
            *(undefined8 *)pfVar9 = uVar13;
            *(undefined8 *)(pfVar9 + 2) = uVar12;
            *(undefined8 *)(pfVar9 + 4) = uVar14;
            *(undefined8 *)(pfVar9 + 6) = uVar15;
            pfVar10 = pfVar10 + 8;
            pfVar9 = pfVar9 + 8;
            uVar6 = uVar7 + 8;
            iVar8 = uVar7 + 0xf;
            uVar7 = uVar6;
          } while (iVar8 < local_1ac);
        }
        fStack_17c = local_100[0];
        local_180 = local_100[0];
        fStack_174 = local_100[0];
        fStack_178 = local_100[0];
        uVar7 = uVar6;
        if ((int)(uVar6 | 3) < local_1ac) {
          do {
            local_150 = *(float (*) [2])pfVar10;
            uVar13 = *(undefined8 *)(pfVar10 + 2);
            afStack_148 = (float  [2])uVar13;
            afVar20 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                (&local_1ad,(__m128 *)local_150,(__m128 *)&local_180);
            *(long *)pfVar9 = afVar20._0_8_;
            *(undefined8 *)(pfVar9 + 2) = uVar13;
            pfVar10 = pfVar10 + 4;
            pfVar9 = pfVar9 + 4;
            uVar6 = uVar7 + 4;
            iVar8 = uVar7 + 7;
            uVar7 = uVar6;
          } while (iVar8 < local_1ac);
        }
        iVar8 = local_1ac - uVar6;
        if ((int)uVar6 < local_1ac) {
          lVar5 = 0;
          do {
            fVar11 = powf(pfVar10[lVar5],local_100[0]);
            pfVar9[lVar5] = fVar11;
            lVar5 = lVar5 + 1;
          } while (iVar8 != (int)lVar5);
        }
        local_188 = local_188 + 1;
      } while (local_188 != local_1a8);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}